

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * validateInnerProductWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  string *psVar1;
  bool bVar2;
  WeightParamType WVar3;
  WeightParamType WVar4;
  InnerProductLayerParams *pIVar5;
  BatchedMatMulLayerParams *pBVar6;
  unsigned_long uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte bVar8;
  uint64_t local_228;
  string err;
  unsigned_long local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string layer_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  layer_type._M_dataplus._M_p = (pointer)&layer_type.field_2;
  layer_type._M_string_length = 0;
  layer_type.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x415) {
    pBVar6 = CoreML::Specification::NeuralNetworkLayer::batchedmatmul(layer);
    local_200 = pBVar6->weightmatrixfirstdimension_;
    local_228 = pBVar6->weightmatrixseconddimension_;
    bVar8 = pBVar6->hasbias_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  else {
    if (layer->_oneof_case_[0] != 0x8c) goto LAB_0058ebcf;
    pIVar5 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
    local_200 = pIVar5->inputchannels_;
    local_228 = pIVar5->outputchannels_;
    bVar8 = pIVar5->hasbias_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  WVar3 = CoreML::valueType(weights);
  WVar4 = CoreML::valueType(bias);
  if ((WVar3 == UNSPECIFIED) || ((WVar4 == UNSPECIFIED & bVar8) != 0)) {
    std::operator+(&local_1b0,&layer_type," layer \'");
    std::operator+(&local_1f8,&local_1b0,(layer->name_).ptr_);
    std::operator+(&err,&local_1f8,"\' has invalid weights/bias fields.");
    CoreML::Result::Result((Result *)local_1d8,INVALID_MODEL_PARAMETERS,&err);
LAB_0058eb95:
    CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_1d8);
    std::__cxx11::string::~string((string *)(local_1d8 + 8));
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&local_1f8);
    this = &local_1b0;
  }
  else {
    if ((bVar8 != 0) &&
       ((WVar3 == FLOAT16 && WVar4 == FLOAT32 || (WVar4 == FLOAT16 && WVar3 == FLOAT32)))) {
      std::operator+(&local_1b0,&layer_type," layer \'");
      std::operator+(&local_1f8,&local_1b0,(layer->name_).ptr_);
      std::operator+(&err,&local_1f8,
                     "has unmatched precisions of weights/bias They should either be half or full precision."
                    );
      CoreML::Result::Result((Result *)local_1d8,INVALID_MODEL_PARAMETERS,&err);
      goto LAB_0058eb95;
    }
    if (WVar3 < QUINT) {
      if (WVar3 == FLOAT32) {
        uVar7 = (unsigned_long)(weights->floatvalue_).current_size_;
      }
      else {
        uVar7 = ((weights->float16value_).ptr_)->_M_string_length >> 1;
      }
      if (local_200 * local_228 - uVar7 == 0) goto joined_r0x0058ec93;
      std::operator+(&local_90,"Layer \'",(layer->name_).ptr_);
      std::operator+(&local_70,&local_90," has incorrect weight matrix size ");
      std::__cxx11::to_string(&local_b0,uVar7);
      std::operator+(&local_50,&local_70,&local_b0);
      std::operator+(&local_170,&local_50," to encode a ");
      std::__cxx11::to_string(&local_d0,local_200);
      std::operator+(&local_150,&local_170,&local_d0);
      std::operator+(&local_130,&local_150,anon_var_dwarf_506eea);
      std::__cxx11::to_string(&local_f0,local_228);
      std::operator+(&local_110,&local_130,&local_f0);
      std::operator+(&local_1b0,&local_110," ");
      std::operator+(&local_1f8,&local_1b0,&layer_type);
      std::operator+(&err,&local_1f8,".");
      CoreML::Result::Result((Result *)local_1d8,INVALID_MODEL_PARAMETERS,&err);
      CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_1d8);
      std::__cxx11::string::~string((string *)(local_1d8 + 8));
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      this = &local_90;
    }
    else {
      if (WVar3 == QUINT) {
        psVar1 = (layer->name_).ptr_;
        std::__cxx11::string::string((string *)&err,"weight",(allocator *)&local_1f8);
        CoreML::validateGeneralWeightParams
                  ((Result *)local_1d8,weights,local_200 * local_228,local_228,&layer_type,psVar1,
                   &err);
        CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_1d8);
        std::__cxx11::string::~string((string *)(local_1d8 + 8));
        std::__cxx11::string::~string((string *)&err);
        bVar2 = CoreML::Result::good(__return_storage_ptr__);
        bVar8 = bVar2 & bVar8;
      }
joined_r0x0058ec93:
      if (bVar8 == 0) goto LAB_0058ebcf;
      if (FLOAT16 < WVar4) {
        if (WVar4 == QUINT) {
          psVar1 = (layer->name_).ptr_;
          std::__cxx11::string::string((string *)&err,"bias",(allocator *)&local_1f8);
          CoreML::validateGeneralWeightParams
                    ((Result *)local_1d8,bias,local_228,1,&layer_type,psVar1,&err);
          CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_1d8);
          std::__cxx11::string::~string((string *)(local_1d8 + 8));
          std::__cxx11::string::~string((string *)&err);
          CoreML::Result::good(__return_storage_ptr__);
        }
        goto LAB_0058ebcf;
      }
      if (WVar4 == FLOAT32) {
        uVar7 = (unsigned_long)(bias->floatvalue_).current_size_;
      }
      else {
        uVar7 = ((bias->float16value_).ptr_)->_M_string_length >> 1;
      }
      if (uVar7 == local_228) goto LAB_0058ebcf;
      std::operator+(&local_130,"Layer \'",(layer->name_).ptr_);
      std::operator+(&local_110,&local_130,"\' has incorrect bias vector size ");
      std::__cxx11::to_string(&local_150,uVar7);
      std::operator+(&local_1b0,&local_110,&local_150);
      std::operator+(&local_1f8,&local_1b0," (expected ");
      std::__cxx11::to_string(&local_170,local_228);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_1f8,&local_170);
      std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d8,").");
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      CoreML::Result::Result((Result *)local_1d8,INVALID_MODEL_PARAMETERS,&err);
      CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_1d8);
      std::__cxx11::string::~string((string *)(local_1d8 + 8));
      this = &err;
    }
  }
  std::__cxx11::string::~string((string *)this);
LAB_0058ebcf:
  std::__cxx11::string::~string((string *)&layer_type);
  return __return_storage_ptr__;
}

Assistant:

static Result validateInnerProductWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t num_inputs;
    uint64_t num_outputs;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct: {
            const auto& params = layer.innerproduct();
            num_inputs = params.inputchannels();
            num_outputs = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Inner product";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kBatchedMatmul: {
            const auto& params = layer.batchedmatmul();
            num_inputs = params.weightmatrixfirstdimension();
            num_outputs = params.weightmatrixseconddimension();
            has_bias = params.hasbias();
            layer_type = "BatchedMatMul";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Check for weight and bias value type
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() + "' has invalid weights/bias fields.");
        return r;
    }
    // Check that weight and bias should both be FP16/32, or quantized
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Check weights
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16){
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(weights.floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(weights.float16value().size() / 2);
        }
        if (num_inputs * num_outputs != weight_size) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layer.name() +
                       " has incorrect weight matrix size " + std::to_string(weight_size) +
                       " to encode a " + std::to_string(num_inputs) + " × " +
                       std::to_string(num_outputs) + " " + layer_type + ".");
            return r;
        }
    } else if (weightsValueType == QUINT){
        r = validateGeneralWeightParams(weights, num_inputs * num_outputs, num_outputs,
                                        layer_type, layer.name(), "weight");
        if (!r.good()) return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias){
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(bias.floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(bias.float16value().size() / 2);
            }
            if (bias_size != num_outputs) {
                std::string err = "Layer '" + layer.name() + "' has incorrect bias vector size " +
                std::to_string(bias_size) + " (expected " + std::to_string(num_outputs) + ").";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            r = validateGeneralWeightParams(bias, num_outputs, 1, layer_type,
                                            layer.name(), "bias");
            if (!r.good()) return r;
        }
    } else if (!has_bias && bias_size > 0) {
        std::string err = "Bias vector being ignored since \"hasBias\" flag not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}